

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall
QMetaObjectBuilder::indexOfConstructor(QMetaObjectBuilder *this,QByteArray *signature)

{
  long lVar1;
  bool bVar2;
  reference this_00;
  reference pvVar3;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QMetaMethodBuilderPrivate *constructor;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *__range1;
  iterator __end1;
  iterator __begin1;
  QByteArray sig;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_34;
  __normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
  local_28;
  char *method;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  method = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::operator_cast_to_char_((QByteArray *)0x3748b8);
  QMetaObject::normalizedSignature(method);
  local_28._M_current = (QMetaMethodBuilderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._M_current =
       (QMetaMethodBuilderPrivate *)
       std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::begin
                 (in_stack_ffffffffffffff90);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::end
            (in_stack_ffffffffffffff90);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (!bVar2) {
      local_34 = -1;
LAB_003749c7:
      QByteArray::~QByteArray((QByteArray *)0x3749d1);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_34;
      }
      __stack_chk_fail();
    }
    this_00 = __gnu_cxx::
              __normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
              ::operator*(&local_28);
    bVar2 = ::operator==((QByteArray *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                         ,in_RDI);
    if (bVar2) {
      pvVar3 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
               front((vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                      *)this_00);
      local_34 = (int)(((long)this_00 - (long)pvVar3) / 0x68);
      goto LAB_003749c7;
    }
    __gnu_cxx::
    __normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

int QMetaObjectBuilder::indexOfConstructor(const QByteArray &signature)
{
    QByteArray sig = QMetaObject::normalizedSignature(signature);
    for (const auto &constructor : d->constructors) {
        if (sig == constructor.signature)
            return int(&constructor - &d->constructors.front());
    }
    return -1;
}